

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

void __thiscall
llvm::yaml::Input::Input
          (Input *this,StringRef InputContent,void *Ctxt,DiagHandlerTy DiagHandler,
          void *DiagHandlerCtxt)

{
  Stream *this_00;
  pointer this_01;
  document_iterator dVar1;
  void *DiagHandlerCtxt_local;
  DiagHandlerTy DiagHandler_local;
  void *Ctxt_local;
  Input *this_local;
  StringRef InputContent_local;
  
  IO::IO(&this->super_IO,Ctxt);
  (this->super_IO)._vptr_IO = (_func_int **)&PTR__Input_030a5350;
  SourceMgr::SourceMgr(&this->SrcMgr);
  this_00 = (Stream *)operator_new(0x10);
  yaml::Stream::Stream(this_00,InputContent,&this->SrcMgr,false,&this->EC);
  std::unique_ptr<llvm::yaml::Stream,std::default_delete<llvm::yaml::Stream>>::
  unique_ptr<std::default_delete<llvm::yaml::Stream>,void>
            ((unique_ptr<llvm::yaml::Stream,std::default_delete<llvm::yaml::Stream>> *)&this->Strm,
             this_00);
  std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>::
  unique_ptr<std::default_delete<llvm::yaml::Input::HNode>,void>
            ((unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>> *)
             &this->TopNode);
  std::error_code::error_code(&this->EC);
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::BumpPtrAllocatorImpl
            (&this->StringAllocator);
  document_iterator::document_iterator(&this->DocIterator);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->BitValuesUsed);
  this->CurrentNode = (HNode *)0x0;
  this->ScalarMatchFound = false;
  if (DiagHandler != (DiagHandlerTy)0x0) {
    SourceMgr::setDiagHandler(&this->SrcMgr,DiagHandler,DiagHandlerCtxt);
  }
  this_01 = std::unique_ptr<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>::
            operator->(&this->Strm);
  dVar1 = yaml::Stream::begin(this_01);
  (this->DocIterator).Doc = dVar1.Doc;
  return;
}

Assistant:

Input::Input(StringRef InputContent, void *Ctxt,
             SourceMgr::DiagHandlerTy DiagHandler, void *DiagHandlerCtxt)
    : IO(Ctxt), Strm(new Stream(InputContent, SrcMgr, false, &EC)) {
  if (DiagHandler)
    SrcMgr.setDiagHandler(DiagHandler, DiagHandlerCtxt);
  DocIterator = Strm->begin();
}